

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_fprintf(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_user_func *pjVar1;
  jx9_value *pObj;
  io_private *piVar2;
  jx9_io_stream *pjVar3;
  char *pcVar4;
  jx9_vm *pVm;
  jx9_real jVar5;
  int nLen;
  fprintf_data sFdata;
  
  if (((nArg < 2) || (((*apArg)->iFlags & 0x100) == 0)) || ((apArg[1]->iFlags & 1) == 0)) {
    pjVar1 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar4 = "Invalid arguments";
LAB_0013f99d:
    jx9VmThrowError(pVm,&pjVar1->sName,2,pcVar4);
  }
  else {
    piVar2 = (io_private *)((*apArg)->x).pOther;
    if ((piVar2 == (io_private *)0x0) || (piVar2->iMagic != 0xfeac14)) {
      pjVar1 = pCtx->pFunc;
      pVm = pCtx->pVm;
      pcVar4 = "Expecting an IO handle";
      goto LAB_0013f99d;
    }
    pjVar3 = piVar2->pStream;
    if ((pjVar3 == (jx9_io_stream *)0x0) ||
       (pjVar3->xWrite == (_func_jx9_int64_void_ptr_void_ptr_jx9_int64 *)0x0)) {
      if (pjVar3 == (jx9_io_stream *)0x0) {
        pcVar4 = "null_stream";
      }
      else {
        pcVar4 = pjVar3->zName;
      }
      jVar5 = 0.0;
      jx9_context_throw_error_format
                (pCtx,2,"IO routine(%s) not implemented in the underlying stream(%s) device",
                 (pCtx->pFunc->sName).zString,pcVar4);
      goto LAB_0013f9aa;
    }
    pcVar4 = jx9_value_to_string(apArg[1],&nLen);
    if (0 < nLen) {
      sFdata.nCount = 0;
      sFdata.pIO = piVar2;
      jx9InputFormat(fprintfConsumer,pCtx,pcVar4,nLen,nArg + -1,apArg + 1,&sFdata,0);
      jVar5 = (jx9_real)sFdata.nCount;
      goto LAB_0013f9aa;
    }
  }
  jVar5 = 0.0;
LAB_0013f9aa:
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = jVar5;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_fprintf(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	fprintf_data sFdata;
	const char *zFormat;
	io_private *pDev;
	int nLen;
	if( nArg < 2 || !jx9_value_is_resource(apArg[0]) || !jx9_value_is_string(apArg[1]) ){
		/* Missing/Invalid arguments, return zero */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Invalid arguments");
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	if( pDev->pStream == 0  || pDev->pStream->xWrite == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device", 
			jx9_function_name(pCtx), pDev->pStream ? pDev->pStream->zName : "null_stream"
			);
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the string format */
	zFormat = jx9_value_to_string(apArg[1], &nLen);
	if( nLen < 1 ){
		/* Empty string, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Prepare our private data */
	sFdata.nCount = 0;
	sFdata.pIO = pDev;
	/* Format the string */
	jx9InputFormat(fprintfConsumer, pCtx, zFormat, nLen, nArg - 1, &apArg[1], (void *)&sFdata, FALSE);
	/* Return total number of bytes written */
	jx9_result_int64(pCtx, sFdata.nCount);
	return JX9_OK;
}